

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O1

void __thiscall GrpParser::unicodeIntOrRange(GrpParser *this)

{
  RefAST *this_00;
  ASTFactory *pAVar1;
  bool bVar2;
  int iVar3;
  NoViableAltException *this_01;
  RefAST tmp149_AST;
  RefAST tmp148_AST;
  RefAST tmp150_AST;
  ASTPair currentAST;
  RefAST unicodeIntOrRange_AST;
  ASTFactory local_b0;
  undefined1 local_a0 [16];
  RefCount<AST> RStack_90;
  RefCount<AST> local_88;
  RefCount<Token> local_80;
  RefCount<Token> local_78;
  ASTFactory local_70;
  RefCount<Token> local_60;
  RefToken local_58;
  RefAST local_50;
  RefAST local_48;
  RefAST local_40;
  RefAST local_38;
  
  this_00 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(this_00,&nullAST);
  local_88.ref = nullAST.ref;
  local_a0._8_8_ = (factory_type)0x0;
  RStack_90.ref = (Ref *)0x0;
  if (nullAST.ref == (Ref *)0x0) {
    local_88.ref = (Ref *)0x0;
  }
  else {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  if (iVar3 == 0x1b) {
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
    local_b0.nodeFactory = (factory_type)nullAST;
    if (iVar3 == 0x20) {
      if (nullAST.ref == (Ref *)0x0) {
        local_b0.nodeFactory = (factory_type)0x0;
      }
      else {
        (nullAST.ref)->count = (nullAST.ref)->count + 1;
      }
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_60,this,1);
      pAVar1 = &(this->super_LLkParser).super_Parser.astFactory;
      ASTFactory::create(&local_b0,(RefToken *)pAVar1);
      RefCount<AST>::operator=((RefCount<AST> *)&local_b0.nodeFactory,(RefCount<AST> *)&local_b0);
      RefCount<AST>::~RefCount((RefCount<AST> *)&local_b0);
      RefCount<Token>::~RefCount(&local_60);
      if ((Ref *)local_b0.nodeFactory == (Ref *)0x0) {
        local_38.ref = (Ref *)0x0;
      }
      else {
        *(uint *)((long)local_b0.nodeFactory + 8) = *(uint *)((long)local_b0.nodeFactory + 8) + 1;
        local_38.ref = (Ref *)local_b0.nodeFactory;
      }
      ASTFactory::addASTChild(pAVar1,(ASTPair *)(local_a0 + 8),&local_38);
      RefCount<AST>::~RefCount(&local_38);
      Parser::match((Parser *)this,0x1b);
      local_b0._vptr_ASTFactory = (_func_int **)nullAST;
      if (nullAST.ref == (Ref *)0x0) {
        local_b0._vptr_ASTFactory = (_func_int **)0x0;
      }
      else {
        (nullAST.ref)->count = (nullAST.ref)->count + 1;
      }
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_70.nodeFactory,this,1);
      ASTFactory::create((ASTFactory *)local_a0,(RefToken *)pAVar1);
      RefCount<AST>::operator=((RefCount<AST> *)&local_b0,(RefCount<AST> *)local_a0);
      RefCount<AST>::~RefCount((RefCount<AST> *)local_a0);
      RefCount<Token>::~RefCount((RefCount<Token> *)&local_70.nodeFactory);
      if ((Ref *)local_b0._vptr_ASTFactory == (Ref *)0x0) {
        local_40.ref = (Ref *)0x0;
      }
      else {
        *(uint *)((long)local_b0._vptr_ASTFactory + 8) =
             *(uint *)((long)local_b0._vptr_ASTFactory + 8) + 1;
        local_40.ref = (Ref *)local_b0._vptr_ASTFactory;
      }
      ASTFactory::makeASTRoot(pAVar1,(ASTPair *)(local_a0 + 8),&local_40);
      RefCount<AST>::~RefCount(&local_40);
      Parser::match((Parser *)this,0x20);
      local_a0._0_8_ = nullAST;
      if (nullAST.ref == (Ref *)0x0) {
        local_a0._0_8_ = (Ref *)0x0;
      }
      else {
        (nullAST.ref)->count = (nullAST.ref)->count + 1;
      }
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_78,this,1);
      ASTFactory::create(&local_70,(RefToken *)pAVar1);
      RefCount<AST>::operator=((RefCount<AST> *)local_a0,(RefCount<AST> *)&local_70);
      RefCount<AST>::~RefCount((RefCount<AST> *)&local_70);
      RefCount<Token>::~RefCount(&local_78);
      if ((Ref *)local_a0._0_8_ == (Ref *)0x0) {
        local_48.ref = (Ref *)0x0;
      }
      else {
        *(uint *)(local_a0._0_8_ + 8) = *(uint *)(local_a0._0_8_ + 8) + 1;
        local_48.ref = (Ref *)local_a0._0_8_;
      }
      ASTFactory::addASTChild(pAVar1,(ASTPair *)(local_a0 + 8),&local_48);
      RefCount<AST>::~RefCount(&local_48);
      Parser::match((Parser *)this,0x1b);
      RefCount<AST>::~RefCount((RefCount<AST> *)local_a0);
      RefCount<AST>::~RefCount((RefCount<AST> *)&local_b0);
      goto LAB_0019eaeb;
    }
  }
  iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  if (iVar3 == 0x1b) {
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
    bVar2 = BitSet::member(&_tokenSet_35,iVar3);
    local_b0.nodeFactory = (factory_type)nullAST;
    if (bVar2) {
      if (nullAST.ref == (Ref *)0x0) {
        local_b0.nodeFactory = (factory_type)0x0;
      }
      else {
        (nullAST.ref)->count = (nullAST.ref)->count + 1;
      }
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_80,this,1);
      pAVar1 = &(this->super_LLkParser).super_Parser.astFactory;
      ASTFactory::create(&local_b0,(RefToken *)pAVar1);
      RefCount<AST>::operator=((RefCount<AST> *)&local_b0.nodeFactory,(RefCount<AST> *)&local_b0);
      RefCount<AST>::~RefCount((RefCount<AST> *)&local_b0);
      RefCount<Token>::~RefCount(&local_80);
      if ((Ref *)local_b0.nodeFactory == (Ref *)0x0) {
        local_50.ref = (Ref *)0x0;
      }
      else {
        *(uint *)((long)local_b0.nodeFactory + 8) = *(uint *)((long)local_b0.nodeFactory + 8) + 1;
        local_50.ref = (Ref *)local_b0.nodeFactory;
      }
      ASTFactory::addASTChild(pAVar1,(ASTPair *)(local_a0 + 8),&local_50);
      RefCount<AST>::~RefCount(&local_50);
      Parser::match((Parser *)this,0x1b);
LAB_0019eaeb:
      RefCount<AST>::~RefCount((RefCount<AST> *)&local_b0.nodeFactory);
      RefCount<AST>::operator=(&local_88,(RefCount<AST> *)(local_a0 + 8));
      RefCount<AST>::operator=(this_00,&local_88);
      RefCount<AST>::~RefCount(&local_88);
      RefCount<AST>::~RefCount(&RStack_90);
      RefCount<AST>::~RefCount((RefCount<AST> *)(local_a0 + 8));
      return;
    }
  }
  this_01 = (NoViableAltException *)__cxa_allocate_exception(0x40);
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_58,this,1);
  NoViableAltException::NoViableAltException(this_01,&local_58);
  __cxa_throw(this_01,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
}

Assistant:

void GrpParser::unicodeIntOrRange() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST unicodeIntOrRange_AST = nullAST;
	
	try {      // for error handling
		{
		if ((LA(1)==LIT_UHEX) && (LA(2)==OP_DOTDOT)) {
			RefAST tmp148_AST = nullAST;
			tmp148_AST = astFactory.create(LT(1));
			astFactory.addASTChild(currentAST, tmp148_AST);
			match(LIT_UHEX);
			RefAST tmp149_AST = nullAST;
			tmp149_AST = astFactory.create(LT(1));
			astFactory.makeASTRoot(currentAST, tmp149_AST);
			match(OP_DOTDOT);
			RefAST tmp150_AST = nullAST;
			tmp150_AST = astFactory.create(LT(1));
			astFactory.addASTChild(currentAST, tmp150_AST);
			match(LIT_UHEX);
		}
		else if ((LA(1)==LIT_UHEX) && (_tokenSet_35.member(LA(2)))) {
			RefAST tmp151_AST = nullAST;
			tmp151_AST = astFactory.create(LT(1));
			astFactory.addASTChild(currentAST, tmp151_AST);
			match(LIT_UHEX);
		}
		else {
			throw NoViableAltException(LT(1));
		}
		
		}
		unicodeIntOrRange_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_35);
	}
	returnAST = unicodeIntOrRange_AST;
}